

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O0

LazyDFS * dg::vr::VRCodeGraph::lazy_dfs_end(void)

{
  DFSIt<dg::vr::VRCodeGraph::LazyVisit> *in_RDI;
  
  memset(in_RDI,0,0x58);
  DFSIt<dg::vr::VRCodeGraph::LazyVisit>::DFSIt(in_RDI);
  return in_RDI;
}

Assistant:

VRCodeGraph::LazyDFS VRCodeGraph::lazy_dfs_end() { return LazyDFS(); }